

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.h
# Opt level: O0

bool Js::PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals
               (JavascriptString *str1,PropertyRecord *str2)

{
  charcount_t cVar1;
  charcount_t cVar2;
  PropertyId propertyId;
  BOOL BVar3;
  char16 *s1;
  char16 *s2;
  undefined1 local_19;
  PropertyRecord *str2_local;
  JavascriptString *str1_local;
  
  cVar1 = JavascriptString::GetLength(str1);
  cVar2 = PropertyRecord::GetLength(str2);
  local_19 = false;
  if (cVar1 == cVar2) {
    propertyId = PropertyRecord::GetPropertyId(str2);
    BVar3 = IsInternalPropertyId(propertyId);
    local_19 = false;
    if (BVar3 == 0) {
      s1 = JavascriptString::GetString(str1);
      s2 = PropertyRecord::GetBuffer(str2);
      cVar1 = JavascriptString::GetLength(str1);
      local_19 = JsUtil::CharacterBuffer<char16_t>::StaticEquals(s1,s2,cVar1);
    }
  }
  return local_19;
}

Assistant:

inline static bool Equals(JavascriptString * str1, PropertyRecord const * str2)
        {
            return (str1->GetLength() == str2->GetLength() && !Js::IsInternalPropertyId(str2->GetPropertyId()) &&
                JsUtil::CharacterBuffer<WCHAR>::StaticEquals(str1->GetString(), str2->GetBuffer(), str1->GetLength()));
        }